

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

string * PSBTRoleName_abi_cxx11_(string *__return_storage_ptr__,PSBTRole role)

{
  allocator<char> *__a;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(role) {
  case CREATOR:
    __s = "creator";
    __a = &local_11;
    break;
  case UPDATER:
    __s = "updater";
    __a = &local_12;
    break;
  case SIGNER:
    __s = "signer";
    __a = &local_13;
    break;
  case FINALIZER:
    __s = "finalizer";
    __a = &local_14;
    break;
  case EXTRACTOR:
    __s = "extractor";
    __a = &local_15;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/psbt.cpp"
                  ,0x215,"std::string PSBTRoleName(PSBTRole)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PSBTRoleName(PSBTRole role) {
    switch (role) {
    case PSBTRole::CREATOR: return "creator";
    case PSBTRole::UPDATER: return "updater";
    case PSBTRole::SIGNER: return "signer";
    case PSBTRole::FINALIZER: return "finalizer";
    case PSBTRole::EXTRACTOR: return "extractor";
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}